

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O2

void __thiscall
CETime::SetTime(CETime *this,vector<double,_std::allocator<double>_> *time_vect,
               CETimeType time_format)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  
  switch(time_format) {
  case UTC:
    this_00 = &local_70;
    std::vector<double,_std::allocator<double>_>::vector(this_00,time_vect);
    SetTime_UTC(this,this_00);
    goto LAB_0014fb3e;
  case GAST:
    this_00 = &local_28;
    break;
  case LAST:
    this_00 = &local_40;
    break;
  case LOCALTIME:
    this_00 = &local_58;
    break;
  default:
    goto switchD_0014fb04_default;
  }
  std::vector<double,_std::allocator<double>_>::vector(this_00,time_vect);
LAB_0014fb3e:
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
switchD_0014fb04_default:
  return;
}

Assistant:

void CETime::SetTime(std::vector<double> time_vect, CETimeType time_format)
{
    // Convert the double into a vector
    if (time_format==CETimeType::UTC) {
        SetTime_UTC(time_vect) ;
    } else if (time_format==CETimeType::GAST) {
        SetTime_GAST(time_vect) ;
    } else if (time_format==CETimeType::LAST) {
        SetTime_LST(time_vect) ;
    } else if (time_format==CETimeType::LOCALTIME) {
        SetTime_LOCALTIME(time_vect) ;
    }
}